

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

void test_quicint(void)

{
  uint8_t *end;
  uint8_t **ppuVar1;
  uint64_t uVar2;
  uint8_t **ppuVar3;
  uint64_t uVar4;
  long lVar5;
  uint8_t pat [1];
  uint8_t *p;
  undefined8 local_48;
  uint8_t *local_40;
  undefined8 local_38;
  
  local_40 = (uint8_t *)&local_48;
  local_48 = (uint8_t **)((ulong)local_48 & 0xffffffffffffff00);
  end = (uint8_t *)((long)&local_48 + 1);
  uVar2 = ptls_decode_quicint(&local_40,end);
  _ok((uint)(uVar2 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5be)
  ;
  _ok((uint)(local_40 == end),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5be)
  ;
  local_48 = (uint8_t **)CONCAT62(local_48._2_6_,0x40);
  local_40 = (uint8_t *)&local_48;
  uVar2 = ptls_decode_quicint(&local_40,(uint8_t *)((long)&local_48 + 2));
  _ok((uint)(uVar2 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5bf)
  ;
  _ok((uint)(local_40 == (uint8_t *)((long)&local_48 + 2)),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5bf)
  ;
  local_48 = (uint8_t **)CONCAT44(local_48._4_4_,0x80);
  local_40 = (uint8_t *)&local_48;
  uVar2 = ptls_decode_quicint(&local_40,(uint8_t *)((long)&local_48 + 4));
  _ok((uint)(uVar2 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5c0)
  ;
  _ok((uint)(local_40 == (uint8_t *)((long)&local_48 + 4)),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5c0)
  ;
  local_40 = (uint8_t *)0xc0;
  local_48 = &local_40;
  uVar2 = ptls_decode_quicint((uint8_t **)&local_48,(uint8_t *)&local_38);
  _ok((uint)(uVar2 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5c1)
  ;
  _ok((uint)(local_48 == (uint8_t **)&local_38),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5c1)
  ;
  local_48 = (uint8_t **)CONCAT71(local_48._1_7_,9);
  local_40 = (uint8_t *)&local_48;
  uVar2 = ptls_decode_quicint(&local_40,end);
  _ok((uint)(uVar2 == 9),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5c2)
  ;
  _ok((uint)(local_40 == end),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5c2)
  ;
  local_48 = (uint8_t **)CONCAT62(local_48._2_6_,0x940);
  local_40 = (uint8_t *)&local_48;
  uVar2 = ptls_decode_quicint(&local_40,(uint8_t *)((long)&local_48 + 2));
  _ok((uint)(uVar2 == 9),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5c3)
  ;
  _ok((uint)(local_40 == (uint8_t *)((long)&local_48 + 2)),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5c3)
  ;
  local_48 = (uint8_t **)CONCAT44(local_48._4_4_,0x9000080);
  local_40 = (uint8_t *)&local_48;
  uVar2 = ptls_decode_quicint(&local_40,(uint8_t *)((long)&local_48 + 4));
  _ok((uint)(uVar2 == 9),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5c4)
  ;
  _ok((uint)(local_40 == (uint8_t *)((long)&local_48 + 4)),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5c4)
  ;
  local_40 = (uint8_t *)0x9000000000000c0;
  local_48 = &local_40;
  uVar2 = ptls_decode_quicint((uint8_t **)&local_48,(uint8_t *)&local_38);
  _ok((uint)(uVar2 == 9),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5c5)
  ;
  _ok((uint)(local_48 == (uint8_t **)&local_38),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5c5)
  ;
  local_48 = (uint8_t **)CONCAT62(local_48._2_6_,0x3452);
  local_40 = (uint8_t *)&local_48;
  uVar2 = ptls_decode_quicint(&local_40,(uint8_t *)((long)&local_48 + 2));
  _ok((uint)(uVar2 == 0x1234),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5c6)
  ;
  _ok((uint)(local_40 == (uint8_t *)((long)&local_48 + 2)),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5c6)
  ;
  local_48 = (uint8_t **)CONCAT44(local_48._4_4_,0x34120080);
  local_40 = (uint8_t *)&local_48;
  uVar2 = ptls_decode_quicint(&local_40,(uint8_t *)((long)&local_48 + 4));
  _ok((uint)(uVar2 == 0x1234),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5c7)
  ;
  _ok((uint)(local_40 == (uint8_t *)((long)&local_48 + 4)),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5c7)
  ;
  local_40 = (uint8_t *)0x34120000000000c0;
  local_48 = &local_40;
  uVar2 = ptls_decode_quicint((uint8_t **)&local_48,(uint8_t *)&local_38);
  _ok((uint)(uVar2 == 0x1234),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5c8)
  ;
  _ok((uint)(local_48 == (uint8_t **)&local_38),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5c8)
  ;
  local_48 = (uint8_t **)CONCAT44(local_48._4_4_,0x78563492);
  local_40 = (uint8_t *)&local_48;
  uVar2 = ptls_decode_quicint(&local_40,(uint8_t *)((long)&local_48 + 4));
  _ok((uint)(uVar2 == 0x12345678),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5c9)
  ;
  _ok((uint)(local_40 == (uint8_t *)((long)&local_48 + 4)),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5c9)
  ;
  local_40 = (uint8_t *)0x78563412000000c0;
  local_48 = &local_40;
  uVar2 = ptls_decode_quicint((uint8_t **)&local_48,(uint8_t *)&local_38);
  _ok((uint)(uVar2 == 0x12345678),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5ca)
  ;
  _ok((uint)(local_48 == (uint8_t **)&local_38),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5ca)
  ;
  local_40 = (uint8_t *)0xefcdab89674523c1;
  local_48 = &local_40;
  uVar2 = ptls_decode_quicint((uint8_t **)&local_48,(uint8_t *)&local_38);
  _ok((uint)(uVar2 == 0x123456789abcdef),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5cb)
  ;
  _ok((uint)(local_48 == (uint8_t **)&local_38),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",0x5cb)
  ;
  lVar5 = 0;
  while( true ) {
    if (lVar5 == 0x40) {
      return;
    }
    local_40 = (uint8_t *)0x7b7b7b7b7b7b7b7b;
    local_38._0_1_ = '{';
    uVar2 = *(uint64_t *)((long)test_quicint::inputs + lVar5);
    ppuVar3 = (uint8_t **)ptls_encode_quicint((uint8_t *)&local_40,uVar2);
    if (8 < (long)ppuVar3 - (long)&local_40) break;
    local_48 = &local_40;
    uVar4 = ptls_decode_quicint((uint8_t **)&local_48,(uint8_t *)((long)&local_38 + 1));
    _ok((uint)(uVar2 == uVar4),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x5d8);
    ppuVar1 = local_48;
    _ok((uint)(local_48 == ppuVar3),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x5d9);
    _ok((uint)(*(char *)ppuVar1 == '{'),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c",
        0x5da);
    lVar5 = lVar5 + 8;
  }
  __assert_fail("enc_end - buf <= PTLS_ENCODE_QUICINT_CAPACITY",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/picotls.c"
                ,0x5d5,"void test_quicint(void)");
}

Assistant:

static void test_quicint(void)
{
#define CHECK_PATTERN(output, ...)                                                                                                 \
    do {                                                                                                                           \
        const uint8_t pat[] = {__VA_ARGS__}, *p = pat;                                                                             \
        ok(output == ptls_decode_quicint(&p, pat + sizeof(pat)));                                                                  \
        ok(p == pat + sizeof(pat));                                                                                                \
    } while (0)
    CHECK_PATTERN(0, 0);
    CHECK_PATTERN(0, 0x40, 0);
    CHECK_PATTERN(0, 0x80, 0, 0, 0);
    CHECK_PATTERN(0, 0xc0, 0, 0, 0, 0, 0, 0, 0);
    CHECK_PATTERN(9, 9);
    CHECK_PATTERN(9, 0x40, 9);
    CHECK_PATTERN(9, 0x80, 0, 0, 9);
    CHECK_PATTERN(9, 0xc0, 0, 0, 0, 0, 0, 0, 9);
    CHECK_PATTERN(0x1234, 0x52, 0x34);
    CHECK_PATTERN(0x1234, 0x80, 0, 0x12, 0x34);
    CHECK_PATTERN(0x1234, 0xc0, 0, 0, 0, 0, 0, 0x12, 0x34);
    CHECK_PATTERN(0x12345678, 0x92, 0x34, 0x56, 0x78);
    CHECK_PATTERN(0x12345678, 0xc0, 0, 0, 0, 0x12, 0x34, 0x56, 0x78);
    CHECK_PATTERN(0x123456789abcdef, 0xc1, 0x23, 0x45, 0x67, 0x89, 0xab, 0xcd, 0xef);
#undef CHECK_PATTERN

    static uint64_t inputs[] = {0, 1, 63, 64, 16383, 16384, 1073741823, 1073741824, UINT64_MAX};
    size_t i;

    for (i = 0; inputs[i] != UINT64_MAX; ++i) {
        uint8_t buf[PTLS_ENCODE_QUICINT_CAPACITY + 1];
        memset(buf, 123, sizeof(buf));
        uint8_t *enc_end = ptls_encode_quicint(buf, inputs[i]);
        assert(enc_end - buf <= PTLS_ENCODE_QUICINT_CAPACITY);
        const uint8_t *src = buf;
        uint64_t decoded = ptls_decode_quicint(&src, buf + sizeof(buf));
        ok(inputs[i] == decoded);
        ok(src == enc_end);
        ok(*src == 123);
    }
}